

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_addLiteral
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t literalValue)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_context_t *value;
  sysbvm_tuple_t newLiteralOperand;
  size_t literalIndex;
  sysbvm_tuple_t existent;
  sysbvm_tuple_t literalValue_local;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  literalIndex = 0;
  existent = literalValue;
  literalValue_local = (sysbvm_tuple_t)assembler;
  assembler_local = (sysbvm_functionBytecodeAssembler_t *)context;
  _Var1 = sysbvm_identityDictionary_find(assembler->literalDictionary,literalValue,&literalIndex);
  if (_Var1) {
    context_local = (sysbvm_context_t *)literalIndex;
  }
  else {
    sVar2 = sysbvm_orderedCollection_getSize(*(sysbvm_tuple_t *)(literalValue_local + 0x20));
    value = (sysbvm_context_t *)
            sysbvm_functionBytecodeAssemblerVectorOperand_create
                      ((sysbvm_context_t *)assembler_local,SYSBVM_OPERAND_VECTOR_BITS,(int16_t)sVar2
                      );
    sysbvm_orderedCollection_add
              ((sysbvm_context_t *)assembler_local,*(sysbvm_tuple_t *)(literalValue_local + 0x20),
               existent);
    sysbvm_identityDictionary_atPut
              ((sysbvm_context_t *)assembler_local,*(sysbvm_tuple_t *)(literalValue_local + 0x28),
               existent,(sysbvm_tuple_t)value);
    context_local = value;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_addLiteral(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t literalValue)
{
    sysbvm_tuple_t existent = SYSBVM_NULL_TUPLE;
    if(sysbvm_identityDictionary_find(assembler->literalDictionary, literalValue, &existent))
        return existent;

    size_t literalIndex = sysbvm_orderedCollection_getSize(assembler->literals);
    sysbvm_tuple_t newLiteralOperand = sysbvm_functionBytecodeAssemblerVectorOperand_create(context, SYSBVM_OPERAND_VECTOR_LITERAL, (int16_t)literalIndex);
    sysbvm_orderedCollection_add(context, assembler->literals, literalValue);
    sysbvm_identityDictionary_atPut(context, assembler->literalDictionary, literalValue, newLiteralOperand);
    return newLiteralOperand;
}